

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getDest<wasm::MemoryCopy>
          (Replacer *this,MemoryCopy *curr,Name memory,Index sizeIdx,Expression *localSet,
          Expression *additionalCheck)

{
  initializer_list<wasm::Expression_*> __l;
  Index index;
  LocalSet *pLVar1;
  Function *func;
  LocalSet *pLVar2;
  LocalGet *leftOperand;
  LocalGet *rightOperand;
  Builder *this_00;
  optional<wasm::Type> type;
  undefined1 local_128 [12];
  uintptr_t local_118;
  LocalGet *local_110;
  Expression *destGet;
  allocator<wasm::Expression_*> local_f1;
  LocalSet *local_f0;
  Expression *local_e8;
  LocalSet *local_e0;
  Expression *local_d8;
  LocalSet **local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> exprs;
  Expression *boundsCheck;
  Expression *destSet;
  Index destIdx;
  Expression *sizeSet;
  Expression *destValue;
  Expression *localSet_local;
  Index sizeIdx_local;
  MemoryCopy *curr_local;
  Replacer *this_local;
  Name memory_local;
  
  memory_local.super_IString.str._M_str = (char *)addOffsetGlobal(this,curr->dest,memory);
  if ((this->parent->checkBounds & 1U) != 0) {
    this_00 = &this->builder;
    pLVar1 = Builder::makeLocalSet(this_00,sizeIdx,curr->size);
    func = Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
           ::getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                          ).
                          super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                          .
                          super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                        );
    index = Builder::addVar(func,(Type)(this->parent->pointerType).id);
    pLVar2 = Builder::makeLocalSet
                       (this_00,index,(Expression *)memory_local.super_IString.str._M_str);
    leftOperand = Builder::makeLocalGet(this_00,index,(Type)(this->parent->pointerType).id);
    rightOperand = Builder::makeLocalGet(this_00,sizeIdx,(Type)(this->parent->pointerType).id);
    exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = memory.super_IString.str._M_len;
    local_d8 = makeAddGtuMemoryTrap
                         (this,(Expression *)leftOperand,(Expression *)rightOperand,memory);
    local_d0 = &local_f0;
    local_c8 = 4;
    local_f0 = pLVar2;
    local_e8 = localSet;
    local_e0 = pLVar1;
    std::allocator<wasm::Expression_*>::allocator(&local_f1);
    __l._M_len = local_c8;
    __l._M_array = (iterator)local_d0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_c0,__l,
               &local_f1);
    std::allocator<wasm::Expression_*>::~allocator(&local_f1);
    if (additionalCheck != (Expression *)0x0) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_c0,
                 &additionalCheck);
    }
    local_118 = (this->parent->pointerType).id;
    local_110 = Builder::makeLocalGet(&this->builder,index,(Type)local_118);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_c0,
               (value_type *)&local_110);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_128);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_128._0_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_128[8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_128._9_3_;
    memory_local.super_IString.str._M_str =
         (char *)Builder::
                 makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                           (&this->builder,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            local_c0,type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_c0);
  }
  return (Expression *)memory_local.super_IString.str._M_str;
}

Assistant:

Expression* getDest(T* curr,
                        Name memory,
                        Index sizeIdx = Index(-1),
                        Expression* localSet = nullptr,
                        Expression* additionalCheck = nullptr) {
      Expression* destValue = addOffsetGlobal(curr->dest, memory);

      if (parent.checkBounds) {
        Expression* sizeSet = builder.makeLocalSet(sizeIdx, curr->size);
        Index destIdx = Builder::addVar(getFunction(), parent.pointerType);
        Expression* destSet = builder.makeLocalSet(destIdx, destValue);
        Expression* boundsCheck = makeAddGtuMemoryTrap(
          builder.makeLocalGet(destIdx, parent.pointerType),
          builder.makeLocalGet(sizeIdx, parent.pointerType),
          memory);
        std::vector<Expression*> exprs = {
          destSet, localSet, sizeSet, boundsCheck};
        if (additionalCheck) {
          exprs.push_back(additionalCheck);
        }
        Expression* destGet = builder.makeLocalGet(destIdx, parent.pointerType);
        exprs.push_back(destGet);
        return builder.makeBlock(exprs);
      }

      return destValue;
    }